

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

Value __thiscall xmrig::String::toJSON(String *this)

{
  char *__s;
  size_t sVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  Value VVar2;
  
  __s = (char *)*in_RSI;
  if (__s == (char *)0x0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    sVar1 = strlen(__s);
    this->m_data = (char *)0x0;
    this->m_size = 0;
    this->m_size = (ulong)__s | 0x405000000000000;
    *(int *)&this->m_data = (int)sVar1;
    in_RDX = extraout_RDX;
  }
  VVar2.data_.s.str = (Ch *)in_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::String::toJSON() const
{
    using namespace rapidjson;

    return isNull() ? Value(kNullType) : Value(StringRef(m_data));
}